

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int xar_close(archive_write *a)

{
  la_zstream_conflict *lastrm;
  void *buff;
  char cVar1;
  undefined4 uVar2;
  void *pvVar3;
  archive_rb_node *paVar4;
  long lVar5;
  heap_data *heap;
  ulong uVar6;
  xmlChar *pxVar7;
  bool bVar8;
  uint uVar9;
  mode_t mVar10;
  uint uVar11;
  wchar_t wVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  archive_rb_node *self;
  xml_writer *writer;
  xmlBufferPtr pxVar16;
  xmlTextWriterPtr pxVar17;
  time_t t;
  char *pcVar18;
  dev_t dVar19;
  int *piVar20;
  time_t tVar21;
  archive_digest *paVar22;
  char *pcVar23;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  char *format;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 uVar24;
  char *format_00;
  undefined8 extraout_RDX_30;
  undefined8 extraout_RDX_31;
  archive_rb_node *paVar25;
  ulong uVar26;
  long lVar27;
  size_t s;
  void *pvVar28;
  char *p;
  size_t len;
  char *name;
  void *value;
  undefined8 local_b0;
  void *local_a8;
  ulong local_a0;
  size_t local_98;
  chksumwork_conflict *local_90;
  archive_md5_ctx *local_88;
  archive_sha1_ctx *local_80;
  code *local_78;
  code *local_70;
  uint64_t local_68;
  char *local_60;
  archive_string local_58;
  size_t local_40;
  void *local_38;
  
  pvVar3 = a->format_data;
  if (*(long *)(*(long *)((long)pvVar3 + 0x18) + 0x60) == 0) {
    return 0;
  }
  local_68 = *(uint64_t *)((long)pvVar3 + 8);
  for (self = __archive_rb_tree_iterate
                        ((archive_rb_tree *)((long)pvVar3 + 0x101b8),(archive_rb_node *)0x0,0);
      self != (archive_rb_node *)0x0;
      self = __archive_rb_tree_iterate((archive_rb_tree *)((long)pvVar3 + 0x101b8),self,1)) {
    paVar4 = self[1].rb_nodes[1];
    archive_entry_set_nlink((archive_entry *)paVar4[1].rb_nodes[1],*(uint *)self[1].rb_nodes);
    if (1 < *(int *)self[1].rb_nodes) {
      paVar4[3].rb_nodes[1] = paVar4;
    }
    for (paVar25 = paVar4[3].rb_nodes[0]; paVar25 != (archive_rb_node *)0x0;
        paVar25 = paVar25[3].rb_nodes[0]) {
      paVar25[3].rb_nodes[1] = paVar4;
      archive_entry_set_nlink((archive_entry *)paVar25[1].rb_nodes[1],*(uint *)self[1].rb_nodes);
    }
  }
  pvVar28 = a->format_data;
  writer = (xml_writer *)calloc(1,0x18);
  uVar26 = 0xffffffff;
  bVar8 = true;
  if (writer == (xml_writer *)0x0) {
LAB_0017c2a8:
    writer = (xml_writer *)0x0;
  }
  else {
    pxVar16 = (xmlBufferPtr)xmlBufferCreate();
    writer->bp = pxVar16;
    if (pxVar16 == (xmlBufferPtr)0x0) {
LAB_0017c2a0:
      free(writer);
      goto LAB_0017c2a8;
    }
    pxVar17 = (xmlTextWriterPtr)xmlNewTextWriterMemory(pxVar16,0);
    writer->writer = pxVar17;
    if (pxVar17 == (xmlTextWriterPtr)0x0) {
      xmlBufferFree(writer->bp);
      goto LAB_0017c2a0;
    }
    bVar8 = false;
    uVar26 = 0;
  }
  if (bVar8) {
    pcVar23 = "xml_writer_create() failed: %d";
LAB_0017cd75:
    archive_set_error(&a->archive,-1,pcVar23,uVar26);
    iVar13 = -0x1e;
  }
  else {
    writer->indent = 4;
    uVar9 = xmlTextWriterStartDocument(writer->writer,"1.0","UTF-8",0);
    if (-1 < (int)uVar9) {
      uVar9 = xmlTextWriterSetIndent(writer->writer,writer->indent);
    }
    if ((int)uVar9 < 0) {
      pcVar23 = "xml_writer_start_document() failed: %d";
LAB_0017cd6b:
      uVar26 = (ulong)uVar9;
      goto LAB_0017cd75;
    }
    uVar9 = xmlTextWriterStartElement(writer->writer,"xar");
    if (((int)uVar9 < 0) ||
       (uVar9 = xmlTextWriterStartElement(writer->writer,"toc"), (int)uVar9 < 0)) {
      pcVar23 = "xml_writer_start_element() failed: %d";
      goto LAB_0017cd6b;
    }
    t = time((time_t *)0x0);
    iVar14 = xmlwrite_time(a,writer,"creation-time",t,0);
    iVar13 = -0x1e;
    if (-1 < iVar14) {
      iVar14 = 0;
      if (*(int *)((long)pvVar28 + 0x80) == 1) {
        iVar14 = 0x14;
      }
      iVar15 = 0x10;
      if (*(int *)((long)pvVar28 + 0x80) != 2) {
        iVar15 = iVar14;
      }
      uVar24 = extraout_RDX;
      local_a8 = pvVar28;
      if (iVar15 == 0) {
LAB_0017c437:
        lVar27 = *(long *)((long)local_a8 + 0x18);
        do {
          if (lVar27 != *(long *)(lVar27 + 0x58)) {
            pvVar28 = a->format_data;
            pcVar23 = *(char **)(lVar27 + 0x88);
            cVar1 = *pcVar23;
            uVar26 = CONCAT71((int7)((ulong)uVar24 >> 8),cVar1);
            pcVar18 = pcVar23;
            while (cVar1 != '\0') {
              if ((char)uVar26 < '\0') {
                uVar26 = uVar26 & 0xfffffffffffffffc;
                if ((char)uVar26 == -0x40) {
                  uVar26 = CONCAT71((int7)(uVar26 >> 8),pcVar18[1]) & 0xffffffffffffffc0;
                  uVar26 = CONCAT71((int7)(uVar26 >> 8),-(char)uVar26);
                }
                uVar9 = xmlTextWriterStartElement(writer->writer,"name",uVar26);
                if ((int)uVar9 < 0) goto LAB_0017cc64;
                uVar9 = xmlTextWriterWriteAttribute(writer->writer,"enctype","base64");
                if ((int)uVar9 < 0) {
                  pcVar23 = "xml_writer_write_attribute() failed: %d";
                  goto LAB_0017cc73;
                }
                uVar9 = xmlTextWriterWriteBase64
                                  (writer->writer,*(undefined8 *)(lVar27 + 0x88),0,
                                   *(undefined4 *)(lVar27 + 0x90));
                if (-1 < (int)uVar9) {
                  uVar9 = xmlTextWriterEndElement(writer->writer);
                  if ((int)uVar9 < 0) goto LAB_0017cd2e;
                  goto LAB_0017c4b2;
                }
                pcVar23 = "xml_writer_write_base64() failed: %d";
                goto LAB_0017cc73;
              }
              pcVar18 = pcVar18 + 1;
              cVar1 = *pcVar18;
              uVar26 = CONCAT71((int7)(uVar26 >> 8),cVar1);
            }
            iVar14 = xmlwrite_string(a,writer,"name",pcVar23);
            uVar24 = extraout_RDX_01;
            if (iVar14 < 0) {
LAB_0017cc7c:
              iVar14 = -0x1e;
            }
            else {
LAB_0017c4b2:
              local_58.s = (char *)0x0;
              local_58.length = 0;
              local_58.buffer_length = 0;
              mVar10 = archive_entry_filetype(*(archive_entry **)(lVar27 + 0x20));
              uVar9 = mVar10 - 0x1000 >> 0xc;
              uVar11 = mVar10 << 0x14 | uVar9;
              if ((uVar11 < 0xc) && ((0xa2bU >> (uVar9 & 0x1f) & 1) != 0)) {
                pcVar23 = &DAT_00198054 + *(int *)(&DAT_00198054 + (ulong)uVar11 * 4);
LAB_0017c5ae:
                pcVar18 = (char *)0x0;
              }
              else {
                lVar5 = *(long *)(lVar27 + 0x50);
                if (lVar5 == 0) {
                  pcVar23 = "file";
                  goto LAB_0017c5ae;
                }
                if (lVar5 == lVar27) {
                  local_58.length = 0;
                  archive_strncat(&local_58,"original",8);
                }
                else {
                  archive_string_sprintf(&local_58,"%d",(ulong)*(uint *)(lVar5 + 0x18));
                }
                pcVar23 = "hardlink";
                pcVar18 = "link";
              }
              iVar14 = xmlwrite_string_attr(a,writer,"type",pcVar23,pcVar18,local_58.s);
              archive_string_free(&local_58);
              uVar24 = extraout_RDX_02;
              if (iVar14 < 0) goto LAB_0017cc7c;
              iVar14 = 0;
              if ((*(byte *)(lVar27 + 0x168) & 1) != 0) goto LAB_0017cc87;
              mVar10 = archive_entry_filetype(*(archive_entry **)(lVar27 + 0x20));
              if ((mVar10 == 0x2000) || (mVar10 == 0x6000)) {
                uVar9 = xmlTextWriterStartElement(writer->writer,"device");
                if ((int)uVar9 < 0) {
LAB_0017cc64:
                  pcVar23 = "xml_writer_start_element() failed: %d";
                }
                else {
                  archive_entry_rdevmajor(*(archive_entry **)(lVar27 + 0x20));
                  iVar14 = xmlwrite_fstring(a,writer,"major","%d");
                  uVar24 = extraout_RDX_04;
                  if (iVar14 < 0) goto LAB_0017cd20;
                  archive_entry_rdevminor(*(archive_entry **)(lVar27 + 0x20));
                  iVar14 = xmlwrite_fstring(a,writer,"minor","%d");
                  uVar24 = extraout_RDX_05;
                  if (iVar14 < 0) goto LAB_0017cc7c;
                  uVar9 = xmlTextWriterEndElement(writer->writer);
                  if (-1 < (int)uVar9) goto LAB_0017c711;
LAB_0017cd2e:
                  pcVar23 = "xml_writer_end_element() failed: %d";
                }
LAB_0017cc73:
                archive_set_error(&a->archive,-1,pcVar23,(ulong)uVar9);
                uVar24 = extraout_RDX_29;
                goto LAB_0017cc7c;
              }
              if ((mVar10 == 0xa000) &&
                 (iVar14 = xmlwrite_string_attr
                                     (a,writer,"link",*(char **)(lVar27 + 0xa0),"type","broken"),
                 uVar24 = extraout_RDX_03, iVar14 < 0)) goto LAB_0017cc7c;
LAB_0017c711:
              archive_entry_ino64(*(archive_entry **)(lVar27 + 0x20));
              iVar14 = xmlwrite_fstring(a,writer,"inode","%jd");
              uVar24 = extraout_RDX_06;
              if (iVar14 < 0) {
LAB_0017cd20:
                iVar14 = -0x1e;
              }
              else {
                dVar19 = archive_entry_dev(*(archive_entry **)(lVar27 + 0x20));
                if (dVar19 != 0) {
                  archive_entry_dev(*(archive_entry **)(lVar27 + 0x20));
                  iVar14 = xmlwrite_fstring(a,writer,"deviceno","%d");
                  uVar24 = extraout_RDX_07;
                  if (iVar14 < 0) goto LAB_0017cd20;
                }
                mVar10 = archive_entry_mode(*(archive_entry **)(lVar27 + 0x20));
                local_b0._0_1_ = '0';
                local_b0._1_1_ = (byte)(mVar10 >> 6) & 7 | 0x30;
                local_b0._2_1_ = (byte)mVar10 >> 3 & 7 | 0x30;
                local_b0._3_1_ = (byte)mVar10 & 7 | 0x30;
                local_b0._4_4_ = local_b0._4_4_ & 0xffffff00;
                iVar14 = xmlwrite_string(a,writer,"mode",(char *)&local_b0);
                uVar24 = extraout_RDX_08;
                if (iVar14 < 0) goto LAB_0017cd20;
                archive_entry_uid(*(archive_entry **)(lVar27 + 0x20));
                iVar14 = xmlwrite_fstring(a,writer,"uid","%d");
                uVar24 = extraout_RDX_09;
                if (iVar14 < 0) goto LAB_0017cd20;
                wVar12 = _archive_entry_uname_l
                                   (*(archive_entry **)(lVar27 + 0x20),(char **)&local_b0,&local_98,
                                    *(archive_string_conv **)((long)pvVar28 + 0x118));
                if (wVar12 != L'\0') {
                  piVar20 = __errno_location();
                  if (*piVar20 != 0xc) {
                    pcVar23 = archive_entry_uname(*(archive_entry **)(lVar27 + 0x20));
                    archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to UTF-8",
                                      pcVar23);
                    iVar15 = -0x14;
                    goto LAB_0017c8a5;
                  }
                  pcVar23 = "Can\'t allocate memory for Uname";
LAB_0017c93e:
                  archive_set_error(&a->archive,0xc,pcVar23);
                  uVar24 = extraout_RDX_12;
                  goto LAB_0017cc7c;
                }
                iVar15 = 0;
LAB_0017c8a5:
                if ((local_98 != 0) &&
                   (iVar14 = xmlwrite_string(a,writer,"user",
                                             (char *)CONCAT44(local_b0._4_4_,
                                                              CONCAT13(local_b0._3_1_,
                                                                       CONCAT12(local_b0._2_1_,
                                                                                CONCAT11(local_b0.
                                                  _1_1_,(char)local_b0))))),
                   uVar24 = extraout_RDX_10, iVar14 < 0)) goto LAB_0017cc7c;
                archive_entry_gid(*(archive_entry **)(lVar27 + 0x20));
                iVar14 = xmlwrite_fstring(a,writer,"gid","%d");
                uVar24 = extraout_RDX_11;
                if (iVar14 < 0) goto LAB_0017cd20;
                wVar12 = _archive_entry_gname_l
                                   (*(archive_entry **)(lVar27 + 0x20),(char **)&local_b0,&local_98,
                                    *(archive_string_conv **)((long)pvVar28 + 0x118));
                if (wVar12 != L'\0') {
                  piVar20 = __errno_location();
                  if (*piVar20 == 0xc) {
                    pcVar23 = "Can\'t allocate memory for Gname";
                    goto LAB_0017c93e;
                  }
                  pcVar23 = archive_entry_gname(*(archive_entry **)(lVar27 + 0x20));
                  archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to UTF-8",
                                    pcVar23);
                  iVar15 = -0x14;
                }
                if ((local_98 != 0) &&
                   (iVar14 = xmlwrite_string(a,writer,"group",
                                             (char *)CONCAT44(local_b0._4_4_,
                                                              CONCAT13(local_b0._3_1_,
                                                                       CONCAT12(local_b0._2_1_,
                                                                                CONCAT11(local_b0.
                                                  _1_1_,(char)local_b0))))),
                   uVar24 = extraout_RDX_13, iVar14 < 0)) goto LAB_0017cc7c;
                wVar12 = archive_entry_ctime_is_set(*(archive_entry **)(lVar27 + 0x20));
                if (wVar12 != L'\0') {
                  tVar21 = archive_entry_ctime(*(archive_entry **)(lVar27 + 0x20));
                  iVar14 = xmlwrite_time(a,writer,"ctime",tVar21,1);
                  uVar24 = extraout_RDX_14;
                  if (iVar14 < 0) goto LAB_0017cd20;
                }
                wVar12 = archive_entry_mtime_is_set(*(archive_entry **)(lVar27 + 0x20));
                if (wVar12 != L'\0') {
                  tVar21 = archive_entry_mtime(*(archive_entry **)(lVar27 + 0x20));
                  iVar14 = xmlwrite_time(a,writer,"mtime",tVar21,1);
                  uVar24 = extraout_RDX_15;
                  if (iVar14 < 0) goto LAB_0017cd20;
                }
                wVar12 = archive_entry_atime_is_set(*(archive_entry **)(lVar27 + 0x20));
                if (wVar12 != L'\0') {
                  tVar21 = archive_entry_atime(*(archive_entry **)(lVar27 + 0x20));
                  iVar14 = xmlwrite_time(a,writer,"atime",tVar21,1);
                  uVar24 = extraout_RDX_16;
                  if (iVar14 < 0) goto LAB_0017cd20;
                }
                pcVar23 = archive_entry_fflags_text(*(archive_entry **)(lVar27 + 0x20));
                if ((pcVar23 != (char *)0x0) &&
                   ((iVar14 = make_fflags_entry(a,writer,"flags",pcVar23), uVar24 = extraout_RDX_17,
                    iVar14 < 0 ||
                    (iVar14 = make_fflags_entry(a,writer,"ext2",pcVar23), uVar24 = extraout_RDX_18,
                    iVar14 < 0)))) goto LAB_0017cc87;
                archive_entry_xattr_reset(*(archive_entry **)(lVar27 + 0x20));
                uVar24 = extraout_RDX_19;
                for (heap = *(heap_data **)(lVar27 + 0xc0); heap != (heap_data *)0x0;
                    heap = heap->next) {
                  archive_entry_xattr_next
                            (*(archive_entry **)(lVar27 + 0x20),&local_60,&local_38,&local_40);
                  pcVar23 = "ea";
                  uVar9 = xmlTextWriterStartElement(writer->writer);
                  if ((int)uVar9 < 0) goto LAB_0017cc64;
                  uVar9 = xml_writer_write_attributef(writer,pcVar23,format,(ulong)(uint)heap->id);
                  if ((int)uVar9 < 0) {
                    pcVar23 = "xml_writer_write_attributef() failed: %d";
                    goto LAB_0017cc73;
                  }
                  iVar14 = xmlwrite_heap(a,writer,heap);
                  uVar24 = extraout_RDX_20;
                  if ((iVar14 < 0) ||
                     (iVar14 = xmlwrite_string(a,writer,"name",local_60), uVar24 = extraout_RDX_21,
                     iVar14 < 0)) goto LAB_0017cc7c;
                  uVar9 = xmlTextWriterEndElement(writer->writer);
                  if ((int)uVar9 < 0) goto LAB_0017cd2e;
                  uVar24 = extraout_RDX_22;
                }
                if (*(long *)(lVar27 + 0xe8) != 0) {
                  uVar9 = xmlTextWriterStartElement(writer->writer,"data");
                  if ((int)uVar9 < 0) goto LAB_0017cc64;
                  iVar14 = xmlwrite_heap(a,writer,(heap_data *)(lVar27 + 0xd0));
                  uVar24 = extraout_RDX_23;
                  if (iVar14 < 0) goto LAB_0017cc7c;
                  uVar9 = xmlTextWriterEndElement(writer->writer);
                  uVar24 = extraout_RDX_24;
                  if ((int)uVar9 < 0) goto LAB_0017cd2e;
                }
                iVar14 = iVar15;
                if (*(long *)(lVar27 + 0x158) != 0) {
                  uVar9 = xmlTextWriterStartElement(writer->writer,"content");
                  if ((int)uVar9 < 0) goto LAB_0017cc64;
                  iVar15 = xmlwrite_string(a,writer,"interpreter",*(char **)(lVar27 + 0x150));
                  uVar24 = extraout_RDX_25;
                  if ((iVar15 < 0) ||
                     (iVar15 = xmlwrite_string(a,writer,"type","script"), uVar24 = extraout_RDX_26,
                     iVar15 < 0)) goto LAB_0017cc7c;
                  uVar9 = xmlTextWriterEndElement(writer->writer);
                  uVar24 = extraout_RDX_27;
                  if ((int)uVar9 < 0) {
                    archive_set_error(&a->archive,-1,"xml_writer_end_element() failed: %d",
                                      (ulong)uVar9);
                    uVar24 = extraout_RDX_28;
                    iVar14 = -0x1e;
                  }
                }
              }
            }
LAB_0017cc87:
            if (iVar14 != 0) goto LAB_0017cd81;
          }
          if (((*(byte *)(lVar27 + 0x168) & 2) == 0) ||
             (lVar5 = *(long *)(lVar27 + 0x60), *(long *)(lVar27 + 0x60) == 0)) {
            if (lVar27 != *(long *)(lVar27 + 0x58)) {
              do {
                uVar9 = xmlTextWriterEndElement(writer->writer);
                if ((int)uVar9 < 0) goto LAB_0017cf06;
                lVar5 = *(long *)(lVar27 + 0x40);
                if (*(long *)(lVar27 + 0x40) != 0) goto LAB_0017cca2;
                lVar27 = *(long *)(lVar27 + 0x58);
                uVar24 = extraout_RDX_31;
              } while (lVar27 != *(long *)(lVar27 + 0x58));
            }
          }
          else {
LAB_0017cca2:
            lVar27 = lVar5;
            pcVar23 = "file";
            uVar9 = xmlTextWriterStartElement(writer->writer);
            if ((int)uVar9 < 0) goto LAB_0017cf0f;
            uVar9 = xml_writer_write_attributef
                              (writer,pcVar23,format_00,(ulong)*(uint *)(lVar27 + 0x18));
            uVar24 = extraout_RDX_30;
            if ((int)uVar9 < 0) {
              pcVar23 = "xml_writer_write_attributef() failed: %d";
              goto LAB_0017cf1f;
            }
          }
          pvVar28 = local_a8;
        } while (lVar27 != *(long *)(lVar27 + 0x58));
        uVar9 = xmlTextWriterEndDocument(writer->writer);
        if (-1 < (int)uVar9) {
          pxVar7 = writer->bp->content;
          local_a0 = (ulong)writer->bp->use;
          *(undefined8 *)((long)pvVar28 + 0x10138) = *(undefined8 *)((long)pvVar28 + 8);
          *(ulong *)((long)pvVar28 + 0x10148) = local_a0;
          iVar14 = *(int *)((long)pvVar28 + 0x80);
          *(int *)((long)pvVar28 + 0x98) = iVar14;
          paVar22 = &__archive_digest;
          if (iVar14 == 1) {
            paVar22 = (archive_digest *)&__archive_digest.sha1init;
            lVar27 = 0xa8;
LAB_0017cfb0:
            (*paVar22->md5init)((archive_sha1_ctx *)(lVar27 + (long)local_a8));
          }
          else if (iVar14 == 2) {
            lVar27 = 0xa0;
            goto LAB_0017cfb0;
          }
          pvVar28 = local_a8;
          lastrm = (la_zstream_conflict *)((long)local_a8 + 200);
          iVar14 = compression_init_encoder_gzip(&a->archive,lastrm,6,iVar14);
          if (iVar14 == 0) {
            local_90 = (chksumwork_conflict *)((long)pvVar28 + 0x98);
            *(xmlChar **)((long)pvVar28 + 200) = pxVar7;
            *(ulong *)((long)pvVar28 + 0xd0) = local_a0;
            *(undefined8 *)((long)pvVar28 + 0xd8) = 0;
            buff = (void *)((long)pvVar28 + 0x120);
            *(void **)((long)pvVar28 + 0xe0) = buff;
            *(undefined8 *)((long)pvVar28 + 0xe8) = 0x10000;
            *(undefined8 *)((long)pvVar28 + 0xf0) = 0;
            local_70 = __archive_md5update;
            local_78 = __archive_sha1update;
            local_80 = (archive_sha1_ctx *)((long)pvVar28 + 0xa8);
            local_88 = (archive_md5_ctx *)((long)pvVar28 + 0xa0);
            do {
              uVar9 = 0;
              if (*(int *)((long)pvVar28 + 0xf8) != 0) {
                uVar9 = (**(code **)((long)pvVar28 + 0x108))(a,lastrm,0);
              }
              iVar14 = 2;
              if (uVar9 < 2) {
                local_a0 = CONCAT44(local_a0._4_4_,uVar9);
                s = 0x10000 - *(long *)((long)pvVar28 + 0xe8);
                if (*(int *)((long)pvVar28 + 0x98) == 2) {
                  (*local_70)(local_88,buff,s);
                }
                else if (*(int *)((long)pvVar28 + 0x98) == 1) {
                  (*local_78)(local_80,buff,s);
                }
                iVar15 = write_to_temp(a,buff,s);
                pvVar28 = local_a8;
                if (iVar15 == 0) {
                  iVar14 = 7;
                  if ((int)local_a0 != 1) {
                    *(void **)((long)local_a8 + 0xe0) = buff;
                    *(undefined8 *)((long)local_a8 + 0xe8) = 0x10000;
                    iVar14 = 0;
                  }
                }
              }
            } while (iVar14 == 0);
            if (iVar14 != 2) {
              if (iVar14 != 7) goto LAB_0017cd9f;
              if ((*(int *)((long)pvVar28 + 0xf8) == 0) ||
                 (iVar14 = (**(code **)((long)pvVar28 + 0x110))(a,lastrm), iVar14 == 0)) {
                *(undefined8 *)((long)pvVar28 + 0x10140) = *(undefined8 *)((long)pvVar28 + 0xf0);
                *(undefined4 *)((long)pvVar28 + 0x10150) = 1;
                checksum_final(local_90,(chksumval_conflict *)((long)pvVar28 + 0x10158));
                iVar13 = 0;
              }
            }
          }
          goto LAB_0017cd81;
        }
        pcVar23 = "xml_writer_end_document() failed: %d";
      }
      else {
        uVar9 = xmlTextWriterStartElement(writer->writer,"checksum");
        if ((int)uVar9 < 0) {
LAB_0017cf0f:
          pcVar23 = "xml_writer_start_element() failed: %d";
        }
        else {
          pcVar23 = (char *)0x0;
          if (*(int *)((long)local_a8 + 0x80) == 1) {
            pcVar23 = "sha1";
          }
          pcVar18 = "md5";
          if (*(int *)((long)local_a8 + 0x80) != 2) {
            pcVar18 = pcVar23;
          }
          uVar9 = xmlTextWriterWriteAttribute(writer->writer,"style",pcVar18);
          if ((int)uVar9 < 0) {
            pcVar23 = "xml_writer_write_attribute() failed: %d";
          }
          else {
            iVar14 = xmlwrite_string(a,writer,"offset","0");
            if ((iVar14 < 0) || (iVar14 = xmlwrite_fstring(a,writer,"size","%d"), iVar14 < 0))
            goto LAB_0017cd81;
            uVar9 = xmlTextWriterEndElement(writer->writer);
            uVar24 = extraout_RDX_00;
            if (-1 < (int)uVar9) goto LAB_0017c437;
LAB_0017cf06:
            pcVar23 = "xml_writer_end_element() failed: %d";
          }
        }
      }
LAB_0017cf1f:
      archive_set_error(&a->archive,-1,pcVar23,(ulong)uVar9);
    }
  }
LAB_0017cd81:
  if (writer != (xml_writer *)0x0) {
    xmlFreeTextWriter(writer->writer);
    xmlBufferFree(writer->bp);
    free(writer);
  }
LAB_0017cd9f:
  if (iVar13 == 0) {
    *(undefined8 *)((long)pvVar3 + 0x120) = 0x1001c0021726178;
    uVar26 = *(ulong *)((long)pvVar3 + 0x10140);
    *(ulong *)((long)pvVar3 + 0x128) =
         uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 | (uVar26 & 0xff0000000000) >> 0x18 |
         (uVar26 & 0xff00000000) >> 8 | (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 |
         (uVar26 & 0xff00) << 0x28 | uVar26 << 0x38;
    uVar6 = *(ulong *)((long)pvVar3 + 0x10148);
    *(ulong *)((long)pvVar3 + 0x130) =
         uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
         (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
         (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    uVar2 = *(undefined4 *)((long)pvVar3 + 0x10158);
    *(char *)((long)pvVar3 + 0x138) = (char)((uint)uVar2 >> 0x18);
    *(char *)((long)pvVar3 + 0x139) = (char)((uint)uVar2 >> 0x10);
    *(char *)((long)pvVar3 + 0x13a) = (char)((uint)uVar2 >> 8);
    *(char *)((long)pvVar3 + 0x13b) = (char)uVar2;
    *(undefined8 *)((long)pvVar3 + 0x10120) = 0xffe4;
    iVar13 = copy_out(a,*(uint64_t *)((long)pvVar3 + 0x10138),uVar26);
    if (iVar13 == 0) {
      if (*(ulong *)((long)pvVar3 + 0x10160) != 0) {
        if (*(ulong *)((long)pvVar3 + 0x10120) < *(ulong *)((long)pvVar3 + 0x10160)) {
          pvVar28 = a->format_data;
          iVar14 = __archive_write_output
                             (a,(void *)((long)pvVar28 + 0x120),
                              0x10000 - *(long *)((long)pvVar28 + 0x10120));
          if (iVar14 != 0) {
            return iVar14;
          }
          *(undefined8 *)((long)pvVar28 + 0x10120) = 0x10000;
        }
        memcpy((void *)((long)pvVar3 + (0x10120 - *(long *)((long)pvVar3 + 0x10120))),
               (void *)((long)pvVar3 + 0x10168),*(size_t *)((long)pvVar3 + 0x10160));
        *(long *)((long)pvVar3 + 0x10120) =
             *(long *)((long)pvVar3 + 0x10120) - *(long *)((long)pvVar3 + 0x10160);
      }
      iVar13 = copy_out(a,*(uint64_t *)((long)pvVar3 + 0x10160),local_68);
      if (iVar13 == 0) {
        pvVar3 = a->format_data;
        iVar13 = __archive_write_output
                           (a,(void *)((long)pvVar3 + 0x120),
                            0x10000 - *(long *)((long)pvVar3 + 0x10120));
        if (iVar13 == 0) {
          *(undefined8 *)((long)pvVar3 + 0x10120) = 0x10000;
        }
      }
    }
  }
  return iVar13;
}

Assistant:

static int
xar_close(struct archive_write *a)
{
	struct xar *xar;
	unsigned char *wb;
	uint64_t length;
	int r;

	xar = (struct xar *)a->format_data;

	/* Empty! */
	if (xar->root->children.first == NULL)
		return (ARCHIVE_OK);

	/* Save the length of all file extended attributes and contents. */
	length = xar->temp_offset;

	/* Connect hardlinked files */
	file_connect_hardlink_files(xar);

	/* Make the TOC */
	r = make_toc(a);
	if (r != ARCHIVE_OK)
		return (r);
	/*
	 * Make the xar header on wbuff(write buffer).
	 */
	wb = xar->wbuff;
	xar->wbuff_remaining = sizeof(xar->wbuff);
	archive_be32enc(&wb[0], HEADER_MAGIC);
	archive_be16enc(&wb[4], HEADER_SIZE);
	archive_be16enc(&wb[6], HEADER_VERSION);
	archive_be64enc(&wb[8], xar->toc.length);
	archive_be64enc(&wb[16], xar->toc.size);
	archive_be32enc(&wb[24], xar->toc.a_sum.alg);
	xar->wbuff_remaining -= HEADER_SIZE;

	/*
	 * Write the TOC
	 */
	r = copy_out(a, xar->toc.temp_offset, xar->toc.length);
	if (r != ARCHIVE_OK)
		return (r);

	/* Write the checksum value of the TOC. */
	if (xar->toc.a_sum.len) {
		if (xar->wbuff_remaining < xar->toc.a_sum.len) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		memcpy(wb, xar->toc.a_sum.val, xar->toc.a_sum.len);
		xar->wbuff_remaining -= xar->toc.a_sum.len;
	}

	/*
	 * Write all file extended attributes and contents.
	 */
	r = copy_out(a, xar->toc.a_sum.len, length);
	if (r != ARCHIVE_OK)
		return (r);
	r = flush_wbuff(a);
	return (r);
}